

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

void __thiscall
QOpenGLShaderProgram::setUniformValueArray
          (QOpenGLShaderProgram *this,int location,QMatrix4x4 *values,int count)

{
  long lVar1;
  ulong uVar2;
  ulong __size;
  undefined1 *__s;
  undefined1 *puVar3;
  long lVar4;
  size_t totalCapacity;
  ulong uVar5;
  long in_FS_OFFSET;
  ulong local_450;
  undefined1 local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (count < 1 || location == -1) goto LAB_0014fa89;
  lVar1 = *(long *)&this->field_0x8;
  __s = local_438;
  memset(__s,0xaa,0x400);
  uVar5 = (ulong)(uint)(count << 4);
  local_450 = 0x100;
  if (0x100 < (uint)(count << 4)) {
    __size = uVar5 * 4;
    uVar2 = QtPrivate::expectedAllocSize(__size,0x10);
    if (uVar2 != 0) {
      uVar5 = uVar2 >> 2;
      __size = uVar2 & 0xfffffffffffffffc;
      if (__size == 0) {
        __s = (undefined1 *)0x0;
        local_450 = uVar5;
        goto LAB_0014fa28;
      }
    }
    __s = (undefined1 *)malloc(__size);
    local_450 = uVar5;
  }
LAB_0014fa28:
  uVar5 = 0;
  puVar3 = __s;
  do {
    lVar4 = 0;
    do {
      *(float *)(puVar3 + lVar4 * 4) = values->m[0][lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    uVar5 = uVar5 + 1;
    values = values + 1;
    puVar3 = puVar3 + 0x40;
  } while (uVar5 != (uint)count);
  (**(code **)(**(long **)(lVar1 + 0xd0) + 0x410))(location,count,0);
  if (__s != local_438) {
    QtPrivate::sizedFree(__s,local_450 << 2);
  }
LAB_0014fa89:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValueArray(int location, const QMatrix4x4 *values, int count)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    setUniformMatrixArray
        (d->glfuncs->glUniformMatrix4fv, location, values, count, QMatrix4x4, 4, 4);
}